

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall cmCPackDebGenerator::PackageComponents(cmCPackDebGenerator *this,bool ignoreGroup)

{
  cmCPackLog *pcVar1;
  long *plVar2;
  uint uVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  size_t sVar7;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  string initialTopLevel;
  ostringstream cmCPackLog_msg;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_cmCPackGenerator).packageFileNames,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,pcVar4,(allocator *)local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (ignoreGroup) {
    p_Var5 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var8 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    uVar9 = 1;
    if ((_Rb_tree_header *)p_Var5 != p_Var8) {
      do {
        uVar3 = PackageOnePack(this,&local_1c8,(string *)(p_Var5 + 1));
        uVar9 = uVar9 & uVar3;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var8);
    }
  }
  else {
    p_Var5 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var8 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
    uVar9 = 1;
    if ((_Rb_tree_header *)p_Var5 != p_Var8) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Packaging component group: ",0x1b);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        plVar2 = local_1e8[0];
        sVar7 = strlen((char *)local_1e8[0]);
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x7b,(char *)plVar2,sVar7);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar3 = PackageOnePack(this,&local_1c8,(string *)(p_Var5 + 1));
        uVar9 = uVar9 & uVar3;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var8);
    }
    p_Var5 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var8 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var8) {
      do {
        if (*(long *)(p_Var5 + 4) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Component <",0xb)
          ;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)(p_Var5 + 2),(long)p_Var5[2]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"> does not belong to any group, package it separately.",0x36);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar2 = local_1e8[0];
          sVar7 = strlen((char *)local_1e8[0]);
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                          ,0x89,(char *)plVar2,sVar7);
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar3 = PackageOnePack(this,&local_1c8,(string *)(p_Var5 + 1));
          uVar9 = uVar9 & uVar3;
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return uVar9;
}

Assistant:

int cmCPackDebGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
    for (compGIt = this->ComponentGroups.begin();
         compGIt != this->ComponentGroups.end(); ++compGIt) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Packaging component group: "
                      << compGIt->first << std::endl);
      // Begin the archive for this group
      retval &= PackageOnePack(initialTopLevel, compGIt->first);
    }
    // Handle Orphan components (components not belonging to any groups)
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt = this->Components.begin(); compIt != this->Components.end();
         ++compIt) {
      // Does the component belong to a group?
      if (compIt->second.Group == CM_NULLPTR) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE, "Component <"
            << compIt->second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        // Begin the archive for this orphan component
        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt = this->Components.begin(); compIt != this->Components.end();
         ++compIt) {
      retval &= PackageOnePack(initialTopLevel, compIt->first);
    }
  }
  return retval;
}